

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

int Ssc_GiaCountCaresSim(Gia_Man_t *p)

{
  ulong uVar1;
  word *__ptr;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  __ptr = Ssc_GiaGetCareMask(p);
  uVar1 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  if ((int)uVar1 < 1) {
    iVar3 = 0;
    if (__ptr == (word *)0x0) {
      return 0;
    }
  }
  else {
    uVar2 = 0;
    iVar3 = 0;
    do {
      uVar4 = __ptr[uVar2] - (__ptr[uVar2] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
      uVar4 = (uVar4 >> 8) + uVar4;
      lVar5 = (uVar4 >> 0x10) + uVar4;
      iVar3 = iVar3 + ((int)((ulong)lVar5 >> 0x20) + (int)lVar5 & 0xffU);
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0xffffffff) != uVar2);
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int Ssc_GiaCountCaresSim( Gia_Man_t * p )
{
    word * pRes = Ssc_GiaGetCareMask( p );
    int nWords = Gia_ObjSimWords( p );
    int Count = Ssc_SimCountBits( pRes, nWords );
    ABC_FREE( pRes );
    return Count;
}